

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_zip_filename_encoding.c
# Opt level: O2

void test_zip_filename_encoding_Russian_Russia(void)

{
  int iVar1;
  char *pcVar2;
  archive_conflict *paVar3;
  archive_entry *paVar4;
  size_t used;
  char buff [4096];
  
  pcVar2 = setlocale(6,"Russian_Russia");
  if (pcVar2 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                   ,L'ď');
    test_skipping("Russian_Russia locale not available on this system.");
    return;
  }
  paVar3 = (archive_conflict *)archive_write_new();
  iVar1 = archive_write_set_format_zip((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                      ,L'Ę',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",
                      (void *)0x0);
  iVar1 = archive_write_set_options((archive *)paVar3,"hdrcharset=UTF-8");
  if (iVar1 != 0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                   ,L'Ě');
    test_skipping("This system cannot convert character-set from Russian_Russia.CP1251 to UTF-8.");
    archive_write_free((archive *)paVar3);
    return;
  }
  iVar1 = archive_write_open_memory((archive *)paVar3,buff,0x1000,&used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                      ,L'Ġ',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
  paVar4 = archive_entry_new2(paVar3);
  archive_entry_set_pathname(paVar4,anon_var_dwarf_43d4a);
  archive_entry_set_filetype(paVar4,0x8000);
  archive_entry_set_size(paVar4,0);
  iVar1 = archive_write_header((archive *)paVar3,paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                      ,L'ħ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",(void *)0x0
                     );
  archive_entry_free(paVar4);
  iVar1 = archive_write_free((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                      ,L'ĩ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                      ,L'ĭ',8,"0x08",(long)buff[7],"buff[7]",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                      ,L'İ',buff + 0x1e,"buff + 30",anon_var_dwarf_43c1c,
                      "\"\\xD0\\xBF\\xD1\\x80\\xD0\\xB8\"",6,"6",(void *)0x0);
  paVar3 = (archive_conflict *)archive_write_new();
  iVar1 = archive_write_set_format_zip((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                      ,L'ķ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_zip(a)",
                      (void *)0x0);
  iVar1 = archive_write_open_memory((archive *)paVar3,buff,0x1000,&used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                      ,L'Ĺ',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
  paVar4 = archive_entry_new2(paVar3);
  archive_entry_set_pathname(paVar4,anon_var_dwarf_43d4a);
  archive_entry_set_filetype(paVar4,0x8000);
  archive_entry_set_size(paVar4,0);
  iVar1 = archive_write_header((archive *)paVar3,paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                      ,L'ŀ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",(void *)0x0
                     );
  archive_entry_free(paVar4);
  iVar1 = archive_write_free((archive *)paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                      ,L'ł',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                      ,L'ņ',0,"0",(long)buff[7],"buff[7]",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_zip_filename_encoding.c"
                      ,L'ŉ',buff + 0x1e,"buff + 30",anon_var_dwarf_43c74,"\"\\xAF\\xE0\\xA8\"",3,
                      "3",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_zip_filename_encoding_Russian_Russia)
{
  	struct archive *a;
  	struct archive_entry *entry;
	char buff[4096];
	size_t used;

	if (NULL == setlocale(LC_ALL, "Russian_Russia")) {
		skipping("Russian_Russia locale not available on this system.");
		return;
	}

	/*
	 * Verify that Russian_Russia(CP1251) filenames are correctly translated
	 * to UTF-8.
	 */
	a = archive_write_new();
	assertEqualInt(ARCHIVE_OK, archive_write_set_format_zip(a));
	if (archive_write_set_options(a, "hdrcharset=UTF-8") != ARCHIVE_OK) {
		skipping("This system cannot convert character-set"
		    " from Russian_Russia.CP1251 to UTF-8.");
		archive_write_free(a);
		return;
	}
	assertEqualInt(ARCHIVE_OK,
	    archive_write_open_memory(a, buff, sizeof(buff), &used));

	entry = archive_entry_new2(a);
	/* Set a CP1251 filename. */
	archive_entry_set_pathname(entry, "\xEF\xF0\xE8");
	archive_entry_set_filetype(entry, AE_IFREG);
	archive_entry_set_size(entry, 0);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* A bit 11 of general purpose flag should be 0x08,
	 * which indicates the filename charset is UTF-8. */
	assertEqualInt(0x08, buff[7]);
	/* Above three characters in CP1251 should translate to the following
	 * three characters (two bytes each) in UTF-8. */
	assertEqualMem(buff + 30, "\xD0\xBF\xD1\x80\xD0\xB8", 6);

	/*
	 * Verify that Russian_Russia(CP1251) filenames are correctly translated
	 * to CP866.
	 */
	a = archive_write_new();
	assertEqualInt(ARCHIVE_OK, archive_write_set_format_zip(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_write_open_memory(a, buff, sizeof(buff), &used));

	entry = archive_entry_new2(a);
	/* Set a CP1251 filename. */
	archive_entry_set_pathname(entry, "\xEF\xF0\xE8");
	archive_entry_set_filetype(entry, AE_IFREG);
	archive_entry_set_size(entry, 0);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* A bit 11 of general purpose flag should be 0,
	 * which indicates the filename charset is unknown. */
	assertEqualInt(0, buff[7]);
	/* Above three characters in CP1251 should translate to the following
	 * three characters in CP866. */
	assertEqualMem(buff + 30, "\xAF\xE0\xA8", 3);
}